

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O0

HRESULT utf8::
        NarrowWideStringConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
        ConvertNoAlloc(LPCWSTR sourceString,size_t sourceCount,LPSTR destStringPtr,size_t destCount,
                      size_t *written)

{
  HRESULT HVar1;
  size_t *written_local;
  size_t destCount_local;
  LPSTR destStringPtr_local;
  size_t sourceCount_local;
  LPCWSTR sourceString_local;
  
  HVar1 = WideStringToNarrowNoAlloc(sourceString,sourceCount,destStringPtr,destCount,written);
  return HVar1;
}

Assistant:

static HRESULT ConvertNoAlloc(
            LPCWSTR sourceString, size_t sourceCount,
            LPSTR destStringPtr, size_t destCount, size_t* written)
        {
            return WideStringToNarrowNoAlloc(
                sourceString, sourceCount, destStringPtr, destCount, written);
        }